

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileLexer.c
# Opt level: O2

yy_state_type yy_get_previous_state(yyscan_t yyscanner)

{
  int iVar1;
  byte *pbVar2;
  byte bVar3;
  long lVar4;
  
  iVar1 = *(int *)((long)yyscanner + 0x4c);
  pbVar2 = *(byte **)((long)yyscanner + 0x80);
LAB_002061cb:
  if (*(byte **)((long)yyscanner + 0x40) <= pbVar2) {
    return iVar1;
  }
  if ((ulong)*pbVar2 == 0) {
    bVar3 = 0x10;
  }
  else {
    bVar3 = ""[*pbVar2];
  }
  if (yy_accept[iVar1] != 0) {
    *(int *)((long)yyscanner + 0x68) = iVar1;
    *(byte **)((long)yyscanner + 0x70) = pbVar2;
  }
  do {
    do {
      lVar4 = (long)yy_base[iVar1] + (ulong)bVar3;
      if (iVar1 == yy_chk[lVar4]) {
        iVar1 = (int)yy_nxt[lVar4];
        pbVar2 = pbVar2 + 1;
        goto LAB_002061cb;
      }
      iVar1 = (int)yy_def[iVar1];
    } while (iVar1 < 0x4f);
    bVar3 = ""[bVar3];
  } while( true );
}

Assistant:

static yy_state_type yy_get_previous_state (yyscan_t yyscanner)
{
	yy_state_type yy_current_state;
	char *yy_cp;
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	yy_current_state = yyg->yy_start;

	for ( yy_cp = yyg->yytext_ptr + YY_MORE_ADJ; yy_cp < yyg->yy_c_buf_p; ++yy_cp )
		{
		YY_CHAR yy_c = (*yy_cp ? yy_ec[YY_SC_TO_UI(*yy_cp)] : 16);
		if ( yy_accept[yy_current_state] )
			{
			yyg->yy_last_accepting_state = yy_current_state;
			yyg->yy_last_accepting_cpos = yy_cp;
			}
		while ( yy_chk[yy_base[yy_current_state] + yy_c] != yy_current_state )
			{
			yy_current_state = (int) yy_def[yy_current_state];
			if ( yy_current_state >= 79 )
				yy_c = yy_meta[yy_c];
			}
		yy_current_state = yy_nxt[yy_base[yy_current_state] + yy_c];
		}

	return yy_current_state;
}